

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

Mat * __thiscall Mat::operator*(Mat *__return_storage_ptr__,Mat *this,Mat *a)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer p_Var4;
  pointer p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong *puVar18;
  ulong *puVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong *puVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  long local_88;
  ulong *local_78;
  long local_50;
  
  lVar17 = (long)a->c;
  Mat(__return_storage_ptr__,this->r,a->c);
  if (0 < lVar17) {
    uVar14 = this->r;
    uVar22 = (ulong)uVar14;
    iVar1 = this->order;
    iVar2 = a->order;
    local_50 = 0;
    local_88 = 0;
    do {
      if (0 < (int)uVar14) {
        uVar3 = this->c;
        uVar29 = (ulong)uVar3;
        puVar18 = (ulong *)(this->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
                           _M_impl.super__Vector_impl_data._M_start;
        p_Var4 = (a->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar20 = local_88 * uVar22;
        p_Var5 = (__return_storage_ptr__->val).
                 super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar27 = uVar29 * 0x10;
        uVar28 = uVar3 * (int)local_88;
        uVar24 = 0;
        local_78 = puVar18;
        do {
          switch(iVar1 * 2 + iVar2) {
          case 0:
            if (0 < (int)uVar3) {
              uVar21 = *(ulong *)(p_Var5 + lVar20 + uVar24);
              uVar23 = *(ulong *)((long)p_Var5 + uVar24 * 0x10 + lVar20 * 0x10 + 8);
              lVar26 = 0;
              puVar19 = local_78;
              do {
                uVar16 = *(ulong *)((long)p_Var4 + lVar26 + (ulong)uVar28 * 0x10);
                auVar6._8_8_ = 0;
                auVar6._0_8_ = uVar16;
                auVar9._8_8_ = 0;
                auVar9._0_8_ = *puVar19;
                uVar15 = SUB168(auVar6 * auVar9,0);
                bVar30 = CARRY8(uVar21,uVar15);
                uVar21 = uVar21 + uVar15;
                uVar23 = uVar23 + SUB168(auVar6 * auVar9,8) + puVar19[1] * uVar16 +
                                  *(long *)((long)p_Var4 + lVar26 + (ulong)uVar28 * 0x10 + 8) *
                                  *puVar19 + (ulong)bVar30;
                *(ulong *)(p_Var5 + lVar20 + uVar24) = uVar21;
                *(ulong *)((long)(p_Var5 + lVar20 + uVar24) + 8) = uVar23;
                lVar26 = lVar26 + 0x10;
                puVar19 = puVar19 + uVar22 * 2;
              } while (lVar27 != lVar26);
            }
            break;
          case 1:
            if (0 < (int)uVar3) {
              uVar21 = *(ulong *)(p_Var5 + lVar20 + uVar24);
              uVar23 = *(ulong *)((long)p_Var5 + uVar24 * 0x10 + lVar20 * 0x10 + 8);
              puVar19 = (ulong *)(local_50 + (long)p_Var4);
              uVar16 = uVar29;
              puVar25 = local_78;
              do {
                auVar8._8_8_ = 0;
                auVar8._0_8_ = *puVar19;
                auVar12._8_8_ = 0;
                auVar12._0_8_ = *puVar25;
                uVar15 = SUB168(auVar8 * auVar12,0);
                bVar30 = CARRY8(uVar21,uVar15);
                uVar21 = uVar21 + uVar15;
                uVar23 = uVar23 + *puVar25 * puVar19[1] +
                                  SUB168(auVar8 * auVar12,8) + puVar25[1] * *puVar19 + (ulong)bVar30
                ;
                *(ulong *)(p_Var5 + lVar20 + uVar24) = uVar21;
                *(ulong *)((long)(p_Var5 + lVar20 + uVar24) + 8) = uVar23;
                puVar19 = puVar19 + lVar17 * 2;
                puVar25 = puVar25 + uVar22 * 2;
                uVar16 = uVar16 - 1;
              } while (uVar16 != 0);
            }
            break;
          case 2:
            if (0 < (int)uVar3) {
              uVar21 = *(ulong *)(p_Var5 + lVar20 + uVar24);
              uVar23 = *(ulong *)((long)p_Var5 + uVar24 * 0x10 + lVar20 * 0x10 + 8);
              lVar26 = 0;
              do {
                uVar16 = *(ulong *)((long)p_Var4 + lVar26 + (ulong)uVar28 * 0x10);
                auVar7._8_8_ = 0;
                auVar7._0_8_ = uVar16;
                auVar10._8_8_ = 0;
                auVar10._0_8_ = *(ulong *)((long)puVar18 + lVar26);
                uVar15 = SUB168(auVar7 * auVar10,0);
                bVar30 = CARRY8(uVar21,uVar15);
                uVar21 = uVar21 + uVar15;
                uVar23 = uVar23 + *(ulong *)((long)puVar18 + lVar26) *
                                  *(long *)((long)p_Var4 + lVar26 + (ulong)uVar28 * 0x10 + 8) +
                                  uVar16 * *(long *)((long)puVar18 + lVar26 + 8) +
                                  SUB168(auVar7 * auVar10,8) + (ulong)bVar30;
                *(ulong *)(p_Var5 + lVar20 + uVar24) = uVar21;
                *(ulong *)((long)(p_Var5 + lVar20 + uVar24) + 8) = uVar23;
                lVar26 = lVar26 + 0x10;
              } while (lVar27 != lVar26);
            }
            break;
          case 3:
            if (0 < (int)uVar3) {
              uVar21 = *(ulong *)(p_Var5 + lVar20 + uVar24);
              uVar23 = *(ulong *)((long)p_Var5 + uVar24 * 0x10 + lVar20 * 0x10 + 8);
              lVar26 = 0;
              puVar19 = (ulong *)(local_50 + (long)p_Var4);
              do {
                auVar31._8_8_ = 0;
                auVar31._0_8_ = *puVar19;
                auVar11._8_8_ = 0;
                auVar11._0_8_ = *(ulong *)((long)puVar18 + lVar26);
                uVar16 = SUB168(auVar31 * auVar11,0);
                bVar30 = CARRY8(uVar21,uVar16);
                uVar21 = uVar21 + uVar16;
                uVar23 = uVar23 + *(ulong *)((long)puVar18 + lVar26) * puVar19[1] +
                                  SUB168(auVar31 * auVar11,8) +
                                  *(long *)((long)puVar18 + lVar26 + 8) * *puVar19 + (ulong)bVar30;
                *(ulong *)(p_Var5 + lVar20 + uVar24) = uVar21;
                *(ulong *)((long)(p_Var5 + lVar20 + uVar24) + 8) = uVar23;
                lVar26 = lVar26 + 0x10;
                puVar19 = puVar19 + lVar17 * 2;
              } while (lVar27 != lVar26);
            }
          }
          uVar24 = uVar24 + 1;
          puVar18 = puVar18 + uVar29 * 2;
          local_78 = local_78 + 2;
        } while (uVar24 != uVar22);
      }
      local_88 = local_88 + 1;
      local_50 = local_50 + 0x10;
    } while (local_88 != lVar17);
  }
  uVar14 = __return_storage_ptr__->c * __return_storage_ptr__->r;
  if (0 < (int)uVar14) {
    p_Var4 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar17 = 0;
    do {
      auVar31 = __modti3(*(undefined8 *)((long)p_Var4 + lVar17),
                         *(undefined8 *)((long)p_Var4 + lVar17 + 8),0x16345785d8a0003,0);
      uVar22 = auVar31._0_8_;
      auVar13._8_8_ = auVar31._8_8_ + (ulong)(0xfe9cba87a275fffc < uVar22);
      auVar13._0_8_ = uVar22 + 0x16345785d8a0003;
      if ((ulong)(0xfe9cba87a275fffc < uVar22) <= -auVar31._8_8_ - 1U) {
        auVar13 = auVar31;
      }
      *(long *)((long)p_Var4 + lVar17) = auVar13._0_8_;
      *(long *)((long)p_Var4 + lVar17 + 8) = auVar13._8_8_;
      lVar17 = lVar17 + 0x10;
    } while ((ulong)uVar14 << 4 != lVar17);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::operator*(const Mat &a) {
    int tmp_c;
    tmp_c = a.cols();
    Mat ret(r, a.cols());
    int i, j;
    for (int j = 0; j < tmp_c; j++) {
        for (int i = 0; i < r; i++) {
            switch (pair_order_type(this, &a)) {
                case MM_NN:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[k * r + i] * a.val[j * c + k];
                    }
                    break;
                case MM_NT:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[k * r + i] * a.val[k * tmp_c + j];
                    }
                    break;
                case MM_TN:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[i * c + k] * a.val[j * c + k];
                    }
                    break;
                case MM_TT:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[i * c + k] * a.val[k * tmp_c + j];
                    }
                    break;
            }
        }
    }
    ret.residual();
    return ret;
}